

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ApplyWindowSettings(ImGuiWindow *window,ImGuiWindowSettings *settings)

{
  ushort uVar1;
  ushort uVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  undefined1 auVar5 [16];
  
  auVar5 = pshuflw(ZEXT416((uint)settings->Pos),ZEXT416((uint)settings->Pos),0x60);
  IVar3.x = (float)(auVar5._0_4_ >> 0x10);
  IVar3.y = (float)(auVar5._4_4_ >> 0x10);
  window->Pos = IVar3;
  uVar1 = (settings->Size).x;
  if ((0 < (short)uVar1) && (uVar2 = (settings->Size).y, 0 < (short)uVar2)) {
    IVar4.x = (float)uVar1;
    IVar4.y = (float)uVar2;
    window->Size = IVar4;
    window->SizeFull = IVar4;
  }
  window->Collapsed = settings->Collapsed;
  return;
}

Assistant:

static void ApplyWindowSettings(ImGuiWindow* window, ImGuiWindowSettings* settings)
{
    window->Pos = ImTrunc(ImVec2(settings->Pos.x, settings->Pos.y));
    if (settings->Size.x > 0 && settings->Size.y > 0)
        window->Size = window->SizeFull = ImTrunc(ImVec2(settings->Size.x, settings->Size.y));
    window->Collapsed = settings->Collapsed;
}